

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::Parser::LineContents::reset_with_next_line(LineContents *this,csubstr buf,size_t offset)

{
  char *s_;
  code *pcVar1;
  char *pcVar2;
  size_t sVar3;
  LineContents *pLVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  basic_substring<const_char> local_68;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  size_t local_40;
  LineContents *local_38;
  
  uVar6 = buf.len;
  if (uVar6 < offset) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    local_68.str = (char *)0x0;
    local_68.len = 0x767c;
    local_58 = 0;
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_48 = 0x65;
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: offset <= buf.len",0x1f,(anonymous_namespace)::s_default_callbacks);
  }
  if (uVar6 <= offset) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x1fa937,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14c3,"i >= 0 && i < len");
  }
  s_ = buf.str + offset;
  pcVar8 = buf.str + uVar6;
  pcVar9 = s_;
  local_38 = this;
  if ((long)offset < (long)uVar6) {
    do {
      if ((*pcVar9 == '\n') || (*pcVar9 == '\r')) break;
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 < pcVar8);
    if (pcVar9 < s_) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      local_68.str = (char *)0x0;
      local_68.len = 0x7682;
      local_58 = 0;
      pcStack_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_48 = 0x65;
      (*(code *)PTR_error_impl_0023c518)
                ("check failed: e >= b",0x14,(anonymous_namespace)::s_default_callbacks);
    }
  }
  sVar10 = uVar6 - offset;
  if (uVar6 < offset) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x1fa937,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153a,"first >= 0 && first <= len");
  }
  uVar7 = (long)pcVar9 - (long)s_;
  if (uVar7 != 0xffffffffffffffff && uVar6 < uVar7) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x1fa937,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
  }
  if (uVar7 == 0xffffffffffffffff) {
    uVar7 = sVar10;
  }
  if (pcVar9 != s_ && uVar6 < uVar7 + offset) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x1fa937,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<const_char>::basic_substring(&local_68,s_,uVar7);
  sVar3 = local_68.len;
  pcVar2 = local_68.str;
  if ((pcVar9 != pcVar8) && (pcVar9 = pcVar9 + (*pcVar9 == '\r'), pcVar9 != pcVar8)) {
    pcVar8 = pcVar9 + (*pcVar9 == '\n');
  }
  uVar7 = (long)pcVar8 - (long)s_;
  local_40 = sVar10;
  if (pcVar8 < s_) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    local_68.str = (char *)0x0;
    local_68.len = 0x7689;
    local_58 = 0;
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_48 = 0x65;
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: e >= b",0x14,(anonymous_namespace)::s_default_callbacks);
  }
  if (uVar6 < offset) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x1fa937,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153a,"first >= 0 && first <= len");
  }
  if (uVar7 != 0xffffffffffffffff && uVar6 < uVar7) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x1fa937,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
  }
  sVar10 = local_40;
  if (uVar7 != 0xffffffffffffffff) {
    sVar10 = uVar7;
  }
  if ((uVar6 < offset + sVar10) && (pcVar8 != s_)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x1fa937,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<const_char>::basic_substring(&local_68,s_,sVar10);
  pLVar4 = local_38;
  (local_38->full).str = local_68.str;
  (local_38->full).len = local_68.len;
  (local_38->stripped).str = pcVar2;
  (local_38->stripped).len = sVar3;
  (local_38->rem).str = pcVar2;
  (local_38->rem).len = sVar3;
  sVar10 = basic_substring<const_char>::first_not_of(&local_38->full,' ',0);
  pLVar4->indentation = sVar10;
  return;
}

Assistant:

void Parser::LineContents::reset_with_next_line(csubstr buf, size_t offset)
{
    RYML_ASSERT(offset <= buf.len);
    char const* C4_RESTRICT b = &buf[offset];
    char const* C4_RESTRICT e = b;
    // get the current line stripped of newline chars
    while(e < buf.end() && (*e != '\n' && *e != '\r'))
        ++e;
    RYML_ASSERT(e >= b);
    const csubstr stripped_ = buf.sub(offset, static_cast<size_t>(e - b));
    // advance pos to include the first line ending
    if(e != buf.end() && *e == '\r')
        ++e;
    if(e != buf.end() && *e == '\n')
        ++e;
    RYML_ASSERT(e >= b);
    const csubstr full_ = buf.sub(offset, static_cast<size_t>(e - b));
    reset(full_, stripped_);
}